

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O1

void __thiscall
iqxmlrpc::anon_unknown_7::StructBuilder::do_visit_element_end(StructBuilder *this,string *tagname)

{
  Value_ptr VVar1;
  int iVar2;
  Value *this_00;
  XML_RPC_violation *this_01;
  Value_ptr local_40;
  string local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)tagname);
  if (iVar2 == 0) {
    if ((this->state_).curr_ != 3) {
      this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
      Parser::context_abi_cxx11_(&local_38,(this->super_ValueBuilderBase).super_BuilderBase.parser_)
      ;
      XML_RPC_violation::XML_RPC_violation(this_01,&local_38);
      __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (Value *)operator_new(0x10);
    Value::Value(this_00,this->value_);
    local_40.p_ = this_00;
    Struct::insert(this->proxy_,&this->name_,&local_40);
    VVar1.p_ = local_40.p_;
    local_40.p_ = (Value *)0x0;
    if (VVar1.p_ != (Value *)0x0) {
      (*(VVar1.p_)->_vptr_Value[1])();
    }
    StateMachine::set_state(&this->state_,0);
  }
  return;
}

Assistant:

virtual void
  do_visit_element_end(const std::string& tagname)
  {
    if (tagname == "member") {
      if (state_.get_state() != VALUE_READ) {
        throw XML_RPC_violation(parser_.context());
      }

      Value_ptr v(new Value(value_));
      proxy_->insert(name_, v);
      state_.set_state(NONE);
    }
  }